

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseTopOrGroup
          (StructTranslator *this,Reader members,MemberInfo *parent,StructOrGroup *layout)

{
  Reader parent_00;
  Reader members_00;
  Reader parent_01;
  Reader members_01;
  Reader decl;
  Reader decl_00;
  StructOrGroup *pSVar1;
  bool bVar2;
  Which WVar3;
  uint64_t uVar4;
  Iterator IVar5;
  ArrayPtr<const_char> AVar6;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> pVar7;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_430;
  uint *local_420;
  uint *o;
  uint *_o1336;
  CapTableReader *pCStack_408;
  byte *local_400;
  ListElementCount LStack_3f8;
  BitsPerElementN<23> BStack_3f4;
  StructDataBitCount local_3f0;
  StructPointerCount SStack_3ec;
  ElementSize EStack_3ea;
  undefined1 uStack_3e9;
  int iStack_3e8;
  undefined4 uStack_3e4;
  bool local_3d9;
  NullableValue<unsigned_int> local_3d8;
  Reader local_3a0;
  NodeSourceInfoBuilderPair local_370;
  uint local_31c;
  Reader local_318;
  Reader local_2e8;
  uint local_2b4;
  Reader local_2b0;
  Reader local_280;
  bool local_249;
  NullableValue<unsigned_int> local_248;
  Reader local_218;
  NodeSourceInfoBuilderPair local_1e8;
  uint local_194;
  StringPtr local_190;
  Reader local_180;
  ArrayPtr<const_char> local_150;
  uint *local_140;
  uint *subCodeOrder;
  Union *pUStack_130;
  uint independentSubCodeOrder;
  Union *unionLayout;
  Reader local_f8;
  uint local_c8;
  bool local_c1;
  uint local_c0 [4];
  MemberInfo *local_b0;
  MemberInfo *memberInfo;
  Maybe<unsigned_int> ordinal;
  Reader member;
  undefined1 local_60 [8];
  Iterator __end2;
  undefined1 local_40 [8];
  Iterator __begin2;
  Reader *__range2;
  StructOrGroup *pSStack_20;
  uint codeOrder;
  StructOrGroup *layout_local;
  MemberInfo *parent_local;
  StructTranslator *this_local;
  
  __begin2._8_8_ = &members;
  __range2._4_4_ = 0;
  pSStack_20 = layout;
  layout_local = (StructOrGroup *)parent;
  parent_local = (MemberInfo *)this;
  IVar5 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar5.container;
  __begin2.container._0_4_ = IVar5.index;
  local_40 = (undefined1  [8])__end2._8_8_;
  IVar5 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  local_60 = (undefined1  [8])IVar5.container;
  __end2.container._0_4_ = IVar5.index;
  while( true ) {
    bVar2 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                          *)local_40,
                         (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                          *)local_60);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)&ordinal,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)local_40);
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)&memberInfo);
    local_b0 = (MemberInfo *)0x0;
    WVar3 = Declaration::Reader::which((Reader *)&ordinal);
    pSVar1 = layout_local;
    if (WVar3 == FIELD) {
      *(int *)&layout_local[2]._vptr_StructOrGroup =
           *(int *)&layout_local[2]._vptr_StructOrGroup + 1;
      local_c0[0] = __range2._4_4_;
      local_c1 = false;
      __range2._4_4_ = __range2._4_4_ + 1;
      local_b0 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                           (&this->arena,(MemberInfo *)layout_local,local_c0,(Reader *)&ordinal,
                            pSStack_20,&local_c1);
      kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
      add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
                 &this->allMembers,&local_b0);
      Declaration::Reader::getId((Reader *)&unionLayout,(Reader *)&ordinal);
      Declaration::Id::Reader::getOrdinal(&local_f8,(Reader *)&unionLayout);
      uVar4 = LocatedInteger::Reader::getValue(&local_f8);
      local_c8 = (uint)uVar4;
      kj::Maybe<unsigned_int>::operator=((Maybe<unsigned_int> *)&memberInfo,&local_c8);
    }
    else if (WVar3 == UNION) {
      pUStack_130 = kj::Arena::
                    allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&>
                              (&this->arena,pSStack_20);
      subCodeOrder._4_4_ = 0;
      local_140 = (uint *)((long)&subCodeOrder + 4);
      Declaration::Reader::getName(&local_180,(Reader *)&ordinal);
      AVar6 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_180);
      local_150 = AVar6;
      kj::StringPtr::StringPtr(&local_190,"");
      bVar2 = kj::StringPtr::operator==((StringPtr *)&local_150,&local_190);
      pSVar1 = layout_local;
      if (bVar2) {
        local_b0 = (MemberInfo *)layout_local;
        local_140 = (uint *)((long)&__range2 + 4);
      }
      else {
        *(int *)&layout_local[2]._vptr_StructOrGroup =
             *(int *)&layout_local[2]._vptr_StructOrGroup + 1;
        local_194 = __range2._4_4_;
        __range2._4_4_ = __range2._4_4_ + 1;
        capnp::schema::Node::Builder::operator_cast_to_Reader
                  (&local_218,(Builder *)(layout_local + 0x29));
        local_248 = ordinal.ptr;
        parent_00._reader.capTable = local_218._reader.capTable;
        parent_00._reader.segment = local_218._reader.segment;
        parent_00._reader.data = local_218._reader.data;
        parent_00._reader.pointers = local_218._reader.pointers;
        parent_00._reader.dataSize = local_218._reader.dataSize;
        parent_00._reader.pointerCount = local_218._reader.pointerCount;
        parent_00._reader._38_2_ = local_218._reader._38_2_;
        parent_00._reader.nestingLimit = local_218._reader.nestingLimit;
        parent_00._reader._44_4_ = local_218._reader._44_4_;
        decl._reader.capTable = (CapTableReader *)member._reader.segment;
        decl._reader.segment = (SegmentReader *)ordinal.ptr;
        decl._reader.data = member._reader.capTable;
        decl._reader.pointers = (WirePointer *)member._reader.data;
        decl._reader._32_8_ = member._reader.pointers;
        decl._reader._40_8_ = member._reader._32_8_;
        newGroupNode(&local_1e8,this,parent_00,decl);
        local_249 = false;
        local_b0 = kj::Arena::
                   allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                             (&this->arena,(MemberInfo *)pSVar1,&local_194,(Reader *)&ordinal,
                              &local_1e8,&local_249);
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
        add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                  ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
                   &this->allMembers,&local_b0);
      }
      (local_b0->field_21).unionScope = pUStack_130;
      Declaration::Reader::getNestedDecls(&local_280,(Reader *)&ordinal);
      members_00.reader.capTable = local_280.reader.capTable;
      members_00.reader.segment = local_280.reader.segment;
      members_00.reader.ptr = local_280.reader.ptr;
      members_00.reader.elementCount = local_280.reader.elementCount;
      members_00.reader.step = local_280.reader.step;
      members_00.reader.structDataSize = local_280.reader.structDataSize;
      members_00.reader.structPointerCount = local_280.reader.structPointerCount;
      members_00.reader.elementSize = local_280.reader.elementSize;
      members_00.reader._39_1_ = local_280.reader._39_1_;
      members_00.reader.nestingLimit = local_280.reader.nestingLimit;
      members_00.reader._44_4_ = local_280.reader._44_4_;
      traverseUnion(this,(Reader *)&ordinal,members_00,local_b0,pUStack_130,local_140);
      Declaration::Reader::getId(&local_2b0,(Reader *)&ordinal);
      bVar2 = Declaration::Id::Reader::isOrdinal(&local_2b0);
      if (bVar2) {
        Declaration::Reader::getId(&local_318,(Reader *)&ordinal);
        Declaration::Id::Reader::getOrdinal(&local_2e8,&local_318);
        uVar4 = LocatedInteger::Reader::getValue(&local_2e8);
        local_2b4 = (uint)uVar4;
        kj::Maybe<unsigned_int>::operator=((Maybe<unsigned_int> *)&memberInfo,&local_2b4);
      }
    }
    else if (WVar3 == GROUP) {
      *(int *)&layout_local[2]._vptr_StructOrGroup =
           *(int *)&layout_local[2]._vptr_StructOrGroup + 1;
      local_31c = __range2._4_4_;
      __range2._4_4_ = __range2._4_4_ + 1;
      capnp::schema::Node::Builder::operator_cast_to_Reader
                (&local_3a0,(Builder *)(layout_local + 0x29));
      local_3d8 = ordinal.ptr;
      parent_01._reader.capTable = local_3a0._reader.capTable;
      parent_01._reader.segment = local_3a0._reader.segment;
      parent_01._reader.data = local_3a0._reader.data;
      parent_01._reader.pointers = local_3a0._reader.pointers;
      parent_01._reader.dataSize = local_3a0._reader.dataSize;
      parent_01._reader.pointerCount = local_3a0._reader.pointerCount;
      parent_01._reader._38_2_ = local_3a0._reader._38_2_;
      parent_01._reader.nestingLimit = local_3a0._reader.nestingLimit;
      parent_01._reader._44_4_ = local_3a0._reader._44_4_;
      decl_00._reader.capTable = (CapTableReader *)member._reader.segment;
      decl_00._reader.segment = (SegmentReader *)ordinal.ptr;
      decl_00._reader.data = member._reader.capTable;
      decl_00._reader.pointers = (WirePointer *)member._reader.data;
      decl_00._reader._32_8_ = member._reader.pointers;
      decl_00._reader._40_8_ = member._reader._32_8_;
      newGroupNode(&local_370,this,parent_01,decl_00);
      local_3d9 = false;
      local_b0 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                           (&this->arena,(MemberInfo *)pSVar1,&local_31c,(Reader *)&ordinal,
                            &local_370,&local_3d9);
      kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>::
      add<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                ((Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*> *)
                 &this->allMembers,&local_b0);
      Declaration::Reader::getNestedDecls((Reader *)&_o1336,(Reader *)&ordinal);
      members_01.reader.capTable = pCStack_408;
      members_01.reader.segment = (SegmentReader *)_o1336;
      members_01.reader.ptr = local_400;
      members_01.reader.elementCount = LStack_3f8;
      members_01.reader.step = BStack_3f4;
      members_01.reader.structDataSize = local_3f0;
      members_01.reader.structPointerCount = SStack_3ec;
      members_01.reader.elementSize = EStack_3ea;
      members_01.reader._39_1_ = uStack_3e9;
      members_01.reader.nestingLimit = iStack_3e8;
      members_01.reader._44_4_ = uStack_3e4;
      traverseGroup(this,members_01,local_b0,pSStack_20);
    }
    o = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&memberInfo);
    if (o != (uint *)0x0) {
      local_420 = o;
      pVar7 = std::
              make_pair<unsigned_int&,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*&>
                        (o,&local_b0);
      local_430.second = pVar7.second;
      local_430.first = pVar7.first;
      std::
      multimap<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
      ::
      insert<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                ((multimap<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                  *)&this->membersByOrdinal,&local_430);
    }
    kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&memberInfo);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                  *)local_40);
  }
  return;
}

Assistant:

void traverseTopOrGroup(List<Declaration>::Reader members, MemberInfo& parent,
                          StructLayout::StructOrGroup& layout) {
    uint codeOrder = 0;

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member, layout, false);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION: {
          StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(layout);

          uint independentSubCodeOrder = 0;
          uint* subCodeOrder = &independentSubCodeOrder;
          if (member.getName().getValue() == "") {
            memberInfo = &parent;
            subCodeOrder = &codeOrder;
          } else {
            parent.childCount++;
            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                false);
            allMembers.add(memberInfo);
          }
          memberInfo->unionScope = &unionLayout;
          traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, *subCodeOrder);
          if (member.getId().isOrdinal()) {
            ordinal = member.getId().getOrdinal().getValue();
          }
          break;
        }

        case Declaration::GROUP:
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              false);
          allMembers.add(memberInfo);

          // Members of the group are laid out just like they were members of the parent, so we
          // just pass along the parent layout.
          traverseGroup(member.getNestedDecls(), *memberInfo, layout);

          // No ordinal for groups.
          break;

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }